

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O1

opj_bool jp2_read_boxhdr(opj_common_ptr cinfo,opj_cio_t *cio,opj_jp2_box_t *box)

{
  int iVar1;
  uint uVar2;
  opj_bool oVar3;
  OPJ_UINT32 OVar4;
  
  iVar1 = cio_tell(cio);
  box->init_pos = iVar1;
  uVar2 = cio_read(cio,4);
  box->length = uVar2;
  uVar2 = cio_read(cio,4);
  box->type = uVar2;
  OVar4 = box->length;
  if (OVar4 == 0) {
    iVar1 = cio_numbytesleft(cio);
    OVar4 = iVar1 + 8;
  }
  else {
    if (OVar4 != 1) {
      return OVar4;
    }
    uVar2 = cio_read(cio,4);
    if (uVar2 != 0) {
      oVar3 = opj_event_msg(cinfo,1,"Cannot handle box sizes higher than 2^32\n");
      return oVar3;
    }
    uVar2 = cio_read(cio,4);
    box->length = uVar2;
    if (uVar2 != 0) {
      return uVar2;
    }
    iVar1 = cio_numbytesleft(cio);
    OVar4 = iVar1 + 0xc;
  }
  box->length = OVar4;
  return OVar4;
}

Assistant:

static opj_bool jp2_read_boxhdr(opj_common_ptr cinfo, opj_cio_t *cio, opj_jp2_box_t *box) {
	box->init_pos = cio_tell(cio);
	box->length = cio_read(cio, 4);
	box->type = cio_read(cio, 4);
	if (box->length == 1) {
		if (cio_read(cio, 4) != 0) {
			opj_event_msg(cinfo, EVT_ERROR, "Cannot handle box sizes higher than 2^32\n");
			return OPJ_FALSE;
		}
		box->length = cio_read(cio, 4);
		if (box->length == 0) 
			box->length = cio_numbytesleft(cio) + 12;
	}
	else if (box->length == 0) {
		box->length = cio_numbytesleft(cio) + 8;
	}
	
	return OPJ_TRUE;
}